

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture2_CreateTest_E5B9G9R9_Test::TestBody
          (ktxTexture2_CreateTest_E5B9G9R9_Test *this)

{
  bool bVar1;
  char *file;
  ktx_uint32_t in_EDI;
  ktx_uint32_t unaff_retaddr;
  Message *in_stack_00000008;
  AssertHelper *in_stack_00000010;
  AssertionResult gtest_ar;
  ktx_error_code_e result;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 uVar5;
  int in_stack_ffffffffffffffac;
  Type in_stack_ffffffffffffffbc;
  AssertHelper *in_stack_ffffffffffffffc0;
  bool in_stack_ffffffffffffffca;
  bool in_stack_ffffffffffffffcb;
  ktx_uint32_t in_stack_ffffffffffffffcc;
  ktx_uint32_t in_stack_ffffffffffffffd0;
  ktx_uint32_t in_stack_ffffffffffffffd4;
  ktx_uint32_t in_stack_ffffffffffffffd8;
  VkFormat in_stack_ffffffffffffffdc;
  ktxTexture2_CreateTest *in_stack_ffffffffffffffe0;
  ktx_uint32_t in_stack_fffffffffffffff0;
  
  uVar2 = 1;
  uVar3 = 1;
  uVar4 = 0;
  uVar5 = 0;
  ktxTexture2_CreateTest::create
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
             in_stack_fffffffffffffff0,in_EDI,unaff_retaddr,in_stack_ffffffffffffffcb,
             in_stack_ffffffffffffffca);
  testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffffac,uVar5),
             (char *)CONCAT44(in_stack_ffffffffffffffa4,uVar4),
             (ktx_error_code_e *)CONCAT44(in_stack_ffffffffffffff9c,uVar3),
             (ktx_error_code_e *)CONCAT44(in_stack_ffffffffffffff94,uVar2));
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffe0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffc0);
    file = testing::AssertionResult::failure_message((AssertionResult *)0x13255d);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,file,in_stack_ffffffffffffffac,
               (char *)CONCAT44(in_stack_ffffffffffffffa4,uVar4));
    testing::internal::AssertHelper::operator=(in_stack_00000010,in_stack_00000008);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff94,uVar2));
    testing::Message::~Message((Message *)0x1325ab);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1325fb);
  return;
}

Assistant:

TEST_F(ktxTexture2_CreateTest, E5B9G9R9) {
    ktx_error_code_e result = create(VK_FORMAT_E5B9G9R9_UFLOAT_PACK32);
    EXPECT_EQ(result, KTX_SUCCESS);
}